

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

void __thiscall
icu_63::ChineseCalendar::computeChineseFields
          (ChineseCalendar *this,int32_t days,int32_t gyear,int32_t gmonth,UBool setAllFields)

{
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  byte local_61;
  int local_54;
  int32_t theNewYear;
  int32_t cycle;
  int32_t yearOfCycle;
  int32_t dayOfMonth;
  int cycle_year;
  int32_t extended_year;
  uint uStack_34;
  UBool isLeapMonth;
  int32_t month;
  int32_t thisMoon;
  int32_t lastMoon;
  int32_t firstMoon;
  int32_t solsticeAfter;
  int32_t solsticeBefore;
  uint uStack_18;
  UBool setAllFields_local;
  int32_t gmonth_local;
  int32_t gyear_local;
  int32_t days_local;
  ChineseCalendar *this_local;
  
  solsticeAfter._3_1_ = setAllFields;
  solsticeBefore = gmonth;
  uStack_18 = gyear;
  gmonth_local = days;
  _gyear_local = this;
  lastMoon = (*(this->super_Calendar).super_UObject._vptr_UObject[0x32])(this,(ulong)(uint)gyear);
  if (gmonth_local < lastMoon) {
    firstMoon = (*(this->super_Calendar).super_UObject._vptr_UObject[0x32])
                          (this,(ulong)(uStack_18 - 1));
  }
  else {
    firstMoon = lastMoon;
    lastMoon = (*(this->super_Calendar).super_UObject._vptr_UObject[0x32])
                         (this,(ulong)(uStack_18 + 1));
  }
  thisMoon = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                       ((double)(firstMoon + 1),this,1);
  month = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])((double)(lastMoon + 1),this,0)
  ;
  uStack_34 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                        ((double)(gmonth_local + 1),this,0);
  iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x34])
                    (this,(ulong)(uint)thisMoon,(ulong)(uint)month);
  (this->super_Calendar).field_0x262 = iVar1 == 0xc;
  extended_year =
       (*(this->super_Calendar).super_UObject._vptr_UObject[0x34])
                 (this,(ulong)(uint)thisMoon,(ulong)uStack_34);
  if (((this->super_Calendar).field_0x262 != '\0') &&
     (iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x37])
                        (this,(ulong)(uint)thisMoon,(ulong)uStack_34), (char)iVar1 != '\0')) {
    extended_year = extended_year + -1;
  }
  if (extended_year < 1) {
    extended_year = extended_year + 0xc;
  }
  local_61 = 0;
  if ((this->super_Calendar).field_0x262 != '\0') {
    iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x36])(this,(ulong)uStack_34);
    iVar3 = thisMoon;
    local_61 = 0;
    if ((char)iVar1 != '\0') {
      uVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                        ((double)(int)(uStack_34 - 0x19),this,0);
      iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x37])
                        (this,(ulong)(uint)iVar3,(ulong)uVar2);
      local_61 = (char)iVar1 != '\0' ^ 0xff;
    }
  }
  cycle_year._3_1_ = local_61 & 1;
  Calendar::internalSet(&this->super_Calendar,UCAL_MONTH,extended_year + -1);
  Calendar::internalSet(&this->super_Calendar,UCAL_IS_LEAP_MONTH,(uint)(cycle_year._3_1_ != 0));
  if (solsticeAfter._3_1_ != '\0') {
    dayOfMonth = uStack_18 - *(int *)&(this->super_Calendar).field_0x264;
    yearOfCycle = uStack_18 + 0xa4c;
    if ((extended_year < 0xb) || (5 < solsticeBefore)) {
      dayOfMonth = dayOfMonth + 1;
      yearOfCycle = uStack_18 + 0xa4d;
    }
    cycle = (gmonth_local - uStack_34) + 1;
    Calendar::internalSet(&this->super_Calendar,UCAL_EXTENDED_YEAR,dayOfMonth);
    iVar3 = ClockMath::floorDivide((double)(yearOfCycle + -1),0x3c,&theNewYear);
    Calendar::internalSet(&this->super_Calendar,UCAL_ERA,iVar3 + 1);
    Calendar::internalSet(&this->super_Calendar,UCAL_YEAR,theNewYear + 1);
    Calendar::internalSet(&this->super_Calendar,UCAL_DATE,cycle);
    local_54 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x39])(this,(ulong)uStack_18);
    if (gmonth_local < local_54) {
      local_54 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x39])
                           (this,(ulong)(uStack_18 - 1));
    }
    Calendar::internalSet(&this->super_Calendar,UCAL_DAY_OF_YEAR,(gmonth_local - local_54) + 1);
  }
  return;
}

Assistant:

void ChineseCalendar::computeChineseFields(int32_t days, int32_t gyear, int32_t gmonth,
                                  UBool setAllFields) {

    // Find the winter solstices before and after the target date.
    // These define the boundaries of this Chinese year, specifically,
    // the position of month 11, which always contains the solstice.
    // We want solsticeBefore <= date < solsticeAfter.
    int32_t solsticeBefore;
    int32_t solsticeAfter = winterSolstice(gyear);
    if (days < solsticeAfter) {
        solsticeBefore = winterSolstice(gyear - 1);
    } else {
        solsticeBefore = solsticeAfter;
        solsticeAfter = winterSolstice(gyear + 1);
    }

    // Find the start of the month after month 11.  This will be either
    // the prior month 12 or leap month 11 (very rare).  Also find the
    // start of the following month 11.
    int32_t firstMoon = newMoonNear(solsticeBefore + 1, TRUE);
    int32_t lastMoon = newMoonNear(solsticeAfter + 1, FALSE);
    int32_t thisMoon = newMoonNear(days + 1, FALSE); // Start of this month
    // Note: isLeapYear is a member variable
    isLeapYear = synodicMonthsBetween(firstMoon, lastMoon) == 12;

    int32_t month = synodicMonthsBetween(firstMoon, thisMoon);
    if (isLeapYear && isLeapMonthBetween(firstMoon, thisMoon)) {
        month--;
    }
    if (month < 1) {
        month += 12;
    }

    UBool isLeapMonth = isLeapYear &&
        hasNoMajorSolarTerm(thisMoon) &&
        !isLeapMonthBetween(firstMoon, newMoonNear(thisMoon - SYNODIC_GAP, FALSE));

    internalSet(UCAL_MONTH, month-1); // Convert from 1-based to 0-based
    internalSet(UCAL_IS_LEAP_MONTH, isLeapMonth?1:0);

    if (setAllFields) {

        // Extended year and cycle year is based on the epoch year
        
        int32_t extended_year = gyear - fEpochYear;
        int cycle_year = gyear - CHINESE_EPOCH_YEAR;
        if (month < 11 ||
            gmonth >= UCAL_JULY) {
            extended_year++;
            cycle_year++;
        }
        int32_t dayOfMonth = days - thisMoon + 1;

        internalSet(UCAL_EXTENDED_YEAR, extended_year);

        // 0->0,60  1->1,1  60->1,60  61->2,1  etc.
        int32_t yearOfCycle;
        int32_t cycle = ClockMath::floorDivide(cycle_year - 1, 60, yearOfCycle);
        internalSet(UCAL_ERA, cycle + 1);
        internalSet(UCAL_YEAR, yearOfCycle + 1);

        internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);

        // Days will be before the first new year we compute if this
        // date is in month 11, leap 11, 12.  There is never a leap 12.
        // New year computations are cached so this should be cheap in
        // the long run.
        int32_t theNewYear = newYear(gyear);
        if (days < theNewYear) {
            theNewYear = newYear(gyear-1);
        }
        internalSet(UCAL_DAY_OF_YEAR, days - theNewYear + 1);
    }
}